

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapping.h
# Opt level: O3

void __thiscall wasm::TrappingFunctionContainer::addToModule(TrappingFunctionContainer *this)

{
  _Rb_tree_node_base *p_Var1;
  map<wasm::Name,_wasm::Function_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  *__range3;
  
  if (this->immediate == false) {
    for (p_Var1 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->functions)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      Module::addFunction(this->wasm,(Function *)p_Var1[1]._M_left);
    }
    for (p_Var1 = (this->imports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->imports)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      Module::addFunction(this->wasm,(Function *)p_Var1[1]._M_left);
    }
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  ::clear((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
           *)this);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>_>
  ::clear(&(this->imports)._M_t);
  return;
}

Assistant:

void addToModule() {
    if (!immediate) {
      for (auto& [_, func] : functions) {
        wasm.addFunction(func);
      }
      for (auto& [_, func] : imports) {
        wasm.addFunction(func);
      }
    }
    functions.clear();
    imports.clear();
  }